

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<ProString_&,_const_char_(&)[7]>,_QString>,_const_char_(&)[3]>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  type *in_RSI;
  QChar **in_stack_ffffffffffffffe8;
  
  QConcatenable<QStringBuilder<QStringBuilder<ProString_&,_const_char_(&)[7]>,_QString>_>::
  appendTo<QChar>(in_RSI,in_stack_ffffffffffffffe8);
  QConcatenable<const_char[3]>::appendTo((char *)in_stack_ffffffffffffffe8,(QChar **)0x22ae94);
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }